

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# font.cc
# Opt level: O1

bool woff2::ReadTrueTypeFont(Buffer *file,uint8_t *data,size_t len,Font *font)

{
  ulong uVar1;
  uint uVar2;
  _Rb_tree_color _Var3;
  ulong uVar4;
  size_t sVar5;
  mapped_type *pmVar6;
  _Base_ptr p_Var7;
  mapped_type *pmVar8;
  _Base_ptr p_Var9;
  uint uVar10;
  _Rb_tree_header *p_Var11;
  _Rb_tree_color _Var12;
  _Rb_tree_header *p_Var13;
  _Rb_tree_color _Var14;
  ushort uVar15;
  bool bVar16;
  map<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
  intervals;
  _Rb_tree_color local_b8;
  uint uStack_b4;
  uint uStack_b0;
  uint uStack_ac;
  uint8_t *local_a8;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_a0;
  Table *pTStack_88;
  uint8_t local_80;
  map<unsigned_int,_woff2::Font::Table,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_woff2::Font::Table>_>_>
  *local_78;
  uint8_t *local_70;
  ulong local_68;
  _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::_Select1st<std::pair<const_unsigned_int,_unsigned_int>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
  local_60;
  
  uVar4 = file->length_;
  sVar5 = file->offset_;
  uVar1 = sVar5 + 2;
  if (uVar1 <= uVar4) {
    font->num_tables =
         *(ushort *)(file->buffer_ + sVar5) << 8 | *(ushort *)(file->buffer_ + sVar5) >> 8;
    file->offset_ = uVar1;
    if (uVar1 <= uVar4 - 6 && sVar5 + 8 <= uVar4) {
      file->offset_ = sVar5 + 8;
      local_60._M_impl.super__Rb_tree_header._M_header._M_left =
           &local_60._M_impl.super__Rb_tree_header._M_header;
      local_60._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      local_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      local_60._M_impl.super__Rb_tree_header._M_node_count = 0;
      local_70 = data;
      local_68 = len;
      local_60._M_impl.super__Rb_tree_header._M_header._M_right =
           local_60._M_impl.super__Rb_tree_header._M_header._M_left;
      if (font->num_tables != 0) {
        local_78 = &font->tables;
        p_Var13 = &(font->tables)._M_t._M_impl.super__Rb_tree_header;
        uVar15 = 0;
        do {
          local_a0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          pTStack_88 = (Table *)0x0;
          local_a0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          local_a0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          local_80 = '\0';
          uVar1 = file->length_;
          sVar5 = file->offset_;
          if (uVar1 < sVar5 + 4) {
LAB_00105f35:
            if (local_a0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_start != (pointer)0x0) {
              operator_delete(local_a0.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start);
            }
            goto LAB_00105f44;
          }
          uVar2 = *(uint *)(file->buffer_ + sVar5);
          local_b8 = uVar2 >> 0x18 | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 | uVar2 << 0x18
          ;
          file->offset_ = sVar5 + 4;
          if (uVar1 < sVar5 + 8) goto LAB_00105f35;
          uVar2 = *(uint *)(file->buffer_ + sVar5 + 4);
          uStack_b4 = uVar2 >> 0x18 | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 |
                      uVar2 << 0x18;
          file->offset_ = sVar5 + 8;
          uVar4 = sVar5 + 0xc;
          if (uVar1 < uVar4) goto LAB_00105f35;
          uVar2 = *(uint *)(file->buffer_ + sVar5 + 8);
          uStack_b0 = uVar2 >> 0x18 | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 |
                      uVar2 << 0x18;
          file->offset_ = uVar4;
          if (uVar1 < sVar5 + 0x10) goto LAB_00105f35;
          uVar10 = *(uint *)(file->buffer_ + uVar4);
          uVar10 = uVar10 >> 0x18 | (uVar10 & 0xff0000) >> 8 | (uVar10 & 0xff00) << 8 |
                   uVar10 << 0x18;
          file->offset_ = sVar5 + 0x10;
          uStack_ac = uVar10;
          if ((((uVar2 >> 0x18 & 3) != 0) || (local_68 < uVar10)) ||
             (local_68 - uVar10 < (ulong)uStack_b0)) goto LAB_00105f35;
          pmVar6 = std::
                   map<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
                   ::operator[]((map<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
                                 *)&local_60,&uStack_b0);
          *pmVar6 = uVar10;
          local_a8 = local_70 + uStack_b0;
          p_Var9 = (font->tables)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
          p_Var7 = &p_Var13->_M_header;
          for (; (_Rb_tree_header *)p_Var9 != (_Rb_tree_header *)0x0;
              p_Var9 = (&p_Var9->_M_left)[bVar16]) {
            bVar16 = (_Rb_tree_color)*(size_t *)(p_Var9 + 1) < local_b8;
            if (!bVar16) {
              p_Var7 = p_Var9;
            }
          }
          p_Var11 = p_Var13;
          if (((_Rb_tree_header *)p_Var7 != p_Var13) &&
             (p_Var11 = (_Rb_tree_header *)p_Var7,
             local_b8 < (_Rb_tree_color)((_Rb_tree_header *)p_Var7)->_M_node_count)) {
            p_Var11 = p_Var13;
          }
          if (p_Var11 != p_Var13) goto LAB_00105f35;
          pmVar8 = std::
                   map<unsigned_int,_woff2::Font::Table,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_woff2::Font::Table>_>_>
                   ::operator[](local_78,&local_b8);
          pmVar8->data = local_a8;
          pmVar8->tag = local_b8;
          pmVar8->checksum = uStack_b4;
          pmVar8->offset = uStack_b0;
          pmVar8->length = uStack_ac;
          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
                    (&pmVar8->buffer,&local_a0);
          pmVar8->flag_byte = local_80;
          pmVar8->reuse_of = pTStack_88;
          if (local_a0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_a0.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start);
          }
          uVar15 = uVar15 + 1;
        } while (uVar15 < font->num_tables);
      }
      p_Var13 = &local_60._M_impl.super__Rb_tree_header;
      if ((_Rb_tree_header *)local_60._M_impl.super__Rb_tree_header._M_header._M_left != p_Var13) {
        _Var14 = (uint)font->num_tables << 4 | 0xc;
        p_Var9 = local_60._M_impl.super__Rb_tree_header._M_header._M_left;
        do {
          _Var3 = p_Var9[1]._M_color;
          if (_Var3 < _Var14) {
            bVar16 = false;
          }
          else {
            _Var12 = *(int *)&p_Var9[1].field_0x4 + _Var3;
            bVar16 = _Var3 <= _Var12;
            if (bVar16) {
              _Var14 = _Var12;
            }
          }
          if (!bVar16) goto LAB_00105f44;
          p_Var9 = (_Base_ptr)std::_Rb_tree_increment(p_Var9);
        } while ((_Rb_tree_header *)p_Var9 != p_Var13);
      }
      p_Var13 = &(font->tables)._M_t._M_impl.super__Rb_tree_header;
      p_Var9 = (font->tables)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
      p_Var7 = &p_Var13->_M_header;
      for (; p_Var9 != (_Base_ptr)0x0; p_Var9 = (&p_Var9->_M_left)[bVar16]) {
        bVar16 = p_Var9[1]._M_color < 0x68656164;
        if (!bVar16) {
          p_Var7 = p_Var9;
        }
      }
      p_Var9 = &p_Var13->_M_header;
      if (((_Rb_tree_header *)p_Var7 != p_Var13) &&
         (p_Var9 = p_Var7, 0x68656164 < p_Var7[1]._M_color)) {
        p_Var9 = &p_Var13->_M_header;
      }
      if (((_Rb_tree_header *)p_Var9 == p_Var13) || (0x33 < *(uint *)((long)&p_Var9[1]._M_left + 4))
         ) {
        bVar16 = true;
      }
      else {
LAB_00105f44:
        bVar16 = false;
      }
      std::
      _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::_Select1st<std::pair<const_unsigned_int,_unsigned_int>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
      ::~_Rb_tree(&local_60);
      return bVar16;
    }
  }
  return false;
}

Assistant:

bool ReadTrueTypeFont(Buffer* file, const uint8_t* data, size_t len,
                      Font* font) {
  // We don't care about the search_range, entry_selector and range_shift
  // fields, they will always be computed upon writing the font.
  if (!file->ReadU16(&font->num_tables) ||
      !file->Skip(6)) {
    return FONT_COMPRESSION_FAILURE();
  }

  std::map<uint32_t, uint32_t> intervals;
  for (uint16_t i = 0; i < font->num_tables; ++i) {
    Font::Table table;
    table.flag_byte = 0;
    table.reuse_of = NULL;
    if (!file->ReadU32(&table.tag) ||
        !file->ReadU32(&table.checksum) ||
        !file->ReadU32(&table.offset) ||
        !file->ReadU32(&table.length)) {
      return FONT_COMPRESSION_FAILURE();
    }
    if ((table.offset & 3) != 0 ||
        table.length > len ||
        len - table.length < table.offset) {
      return FONT_COMPRESSION_FAILURE();
    }
    intervals[table.offset] = table.length;
    table.data = data + table.offset;
    if (font->tables.find(table.tag) != font->tables.end()) {
      return FONT_COMPRESSION_FAILURE();
    }
    font->tables[table.tag] = table;
  }

  // Check that tables are non-overlapping.
  uint32_t last_offset = 12UL + 16UL * font->num_tables;
  for (const auto& i : intervals) {
    if (i.first < last_offset || i.first + i.second < i.first) {
      return FONT_COMPRESSION_FAILURE();
    }
    last_offset = i.first + i.second;
  }

  // Sanity check key tables
  const Font::Table* head_table = font->FindTable(kHeadTableTag);
  if (head_table != NULL && head_table->length < 52) {
    return FONT_COMPRESSION_FAILURE();
  }

  return true;
}